

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialog::done(QInputDialog *this,int result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  double dVar5;
  int iVar6;
  char *pcVar7;
  QObject *pQVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  QArrayData *local_58;
  void **ppvStack_50;
  undefined8 local_48;
  void *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialog::done(&this->super_QDialog,result);
  if (result == 0) goto LAB_00508f5c;
  lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar3 = *(long *)(lVar2 + 800);
  if (lVar3 == 0) {
LAB_00508e22:
    iVar6 = 0;
  }
  else if (lVar3 == *(long *)(lVar2 + 0x300)) {
    iVar6 = 1;
  }
  else {
    if (lVar3 != *(long *)(lVar2 + 0x308)) goto LAB_00508e22;
    iVar6 = 2;
  }
  if (iVar6 == 1) {
    if (*(QSpinBox **)(lVar2 + 0x300) == (QSpinBox *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = QSpinBox::value(*(QSpinBox **)(lVar2 + 0x300));
    }
    local_38 = (void *)CONCAT44(local_38._4_4_,iVar6);
    iVar6 = 3;
  }
  else {
    if (iVar6 != 2) {
      local_58 = *(QArrayData **)(lVar2 + 0x338);
      ppvStack_50 = *(void ***)(lVar2 + 0x340);
      local_48 = *(undefined8 *)(lVar2 + 0x348);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_38 = (void *)0x0;
      puStack_30 = (undefined1 *)&local_58;
      QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      goto LAB_00508f5c;
    }
    if (*(QDoubleSpinBox **)(lVar2 + 0x308) == (QDoubleSpinBox *)0x0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    else {
      dVar5 = QDoubleSpinBox::value(*(QDoubleSpinBox **)(lVar2 + 0x308));
      uVar10 = SUB84(dVar5,0);
      uVar11 = (undefined4)((ulong)dVar5 >> 0x20);
    }
    local_38 = (void *)CONCAT44(uVar11,uVar10);
    iVar6 = 5;
  }
  ppvStack_50 = &local_38;
  local_58 = (QArrayData *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,iVar6,&local_58);
LAB_00508f5c:
  if (((*(long *)(lVar1 + 0x350) != 0) && (*(int *)(*(long *)(lVar1 + 0x350) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x358) != 0)) {
    pcVar9 = *(char **)(lVar1 + 0x368);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)&QByteArray::_empty;
    }
    pcVar9 = signalForMember(pcVar9);
    if ((*(long *)(lVar1 + 0x350) == 0) || (*(int *)(*(long *)(lVar1 + 0x350) + 4) == 0)) {
      pQVar8 = (QObject *)0x0;
    }
    else {
      pQVar8 = *(QObject **)(lVar1 + 0x358);
    }
    pcVar7 = *(char **)(lVar1 + 0x368);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,pcVar9,pQVar8,pcVar7);
    piVar4 = *(int **)(lVar1 + 0x350);
    *(undefined8 *)(lVar1 + 0x350) = 0;
    *(undefined8 *)(lVar1 + 0x358) = 0;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        operator_delete(piVar4);
      }
    }
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::done(int result)
{
    Q_D(QInputDialog);
    QDialog::done(result);
    if (result) {
        InputMode mode = inputMode();
        switch (mode) {
        case DoubleInput:
            emit doubleValueSelected(doubleValue());
            break;
        case IntInput:
            emit intValueSelected(intValue());
            break;
        default:
            Q_ASSERT(mode == TextInput);
            emit textValueSelected(textValue());
        }
    }
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, signalForMember(d->memberToDisconnectOnClose),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}